

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector
          (quad_value_bit_vector *this,quad_value_bit_vector *other)

{
  long lVar1;
  
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
            (&this->bits,
             (long)(other->bits).
                   super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(other->bits).
                   super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                   super__Vector_impl_data._M_start);
  this->N = other->N;
  if (0 < other->N) {
    lVar1 = 0;
    do {
      (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
      super__Vector_impl_data._M_start[lVar1].value =
           (other->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar1].value;
      lVar1 = lVar1 + 1;
    } while (lVar1 < other->N);
  }
  return;
}

Assistant:

quad_value_bit_vector(const quad_value_bit_vector& other) {
      bits.resize(other.bits.size());
      N = other.bitLength();

      for (int i = 0; i < other.bitLength(); i++) {
	bits[i] = other.bits[i];
      }
    }